

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint __thiscall
ON_SubD::ClearComponentMarkBits
          (ON_SubD *this,bool bClearVertexMarkBits,bool bClearEdgeMarkBits,bool bClearFaceMarkBits)

{
  ON__UINT8 OVar1;
  ON_SubDVertex *pOVar2;
  uint uVar3;
  undefined7 in_register_00000031;
  ON_ComponentStatus *pOVar4;
  ON_SubDVertexIterator vit;
  ON_SubDEdgeIterator OStack_68;
  
  uVar3 = 0;
  if ((int)CONCAT71(in_register_00000031,bClearVertexMarkBits) != 0) {
    ON_SubDVertexIterator::ON_SubDVertexIterator((ON_SubDVertexIterator *)&OStack_68,this);
    OStack_68.m_edge_index = 0;
    uVar3 = 0;
    pOVar2 = (ON_SubDVertex *)OStack_68.m_e_first;
    while (pOVar2 != (ON_SubDVertex *)0x0) {
      pOVar4 = &(pOVar2->super_ON_SubDComponentBase).m_status;
      OVar1 = ON_ComponentStatus::MarkBits(pOVar4);
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits(pOVar4,'\0');
        uVar3 = uVar3 + 1;
      }
      pOVar2 = ON_SubDVertexIterator::NextVertex((ON_SubDVertexIterator *)&OStack_68);
    }
    ON_SubDRef::~ON_SubDRef(&OStack_68.m_subd_ref);
  }
  if (bClearEdgeMarkBits) {
    ON_SubDEdgeIterator::ON_SubDEdgeIterator(&OStack_68,this);
    OStack_68.m_edge_index = 0;
    pOVar2 = (ON_SubDVertex *)OStack_68.m_e_first;
    while (pOVar2 != (ON_SubDVertex *)0x0) {
      pOVar4 = &(pOVar2->super_ON_SubDComponentBase).m_status;
      OVar1 = ON_ComponentStatus::MarkBits(pOVar4);
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits(pOVar4,'\0');
        uVar3 = uVar3 + 1;
      }
      pOVar2 = (ON_SubDVertex *)ON_SubDEdgeIterator::NextEdge(&OStack_68);
    }
    ON_SubDRef::~ON_SubDRef(&OStack_68.m_subd_ref);
  }
  if (bClearFaceMarkBits) {
    ON_SubDFaceIterator::ON_SubDFaceIterator((ON_SubDFaceIterator *)&OStack_68,this);
    OStack_68.m_edge_index = 0;
    while ((ON_SubDVertex *)OStack_68.m_e_first != (ON_SubDVertex *)0x0) {
      pOVar4 = &(((ON_SubDVertex *)OStack_68.m_e_first)->super_ON_SubDComponentBase).m_status;
      OVar1 = ON_ComponentStatus::MarkBits(pOVar4);
      if (OVar1 != '\0') {
        ON_ComponentStatus::SetMarkBits(pOVar4,'\0');
        uVar3 = uVar3 + 1;
      }
      OStack_68.m_e_first =
           (ON_SubDEdge *)ON_SubDFaceIterator::NextFace((ON_SubDFaceIterator *)&OStack_68);
    }
    ON_SubDRef::~ON_SubDRef(&OStack_68.m_subd_ref);
  }
  return uVar3;
}

Assistant:

unsigned int ON_SubD::ClearComponentMarkBits(
  bool bClearVertexMarkBits,
  bool bClearEdgeMarkBits,
  bool bClearFaceMarkBits
) const
{
  unsigned int clear_count = 0;

  if (bClearVertexMarkBits)
  {
    ON_SubDVertexIterator vit(*this);
    for (const ON_SubDVertex* v = vit.FirstVertex(); nullptr != v; v = vit.NextVertex())
    {
      if (0 != v->m_status.MarkBits())
      {
        v->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  if (bClearEdgeMarkBits)
  {
    ON_SubDEdgeIterator eit(*this);
    for (const ON_SubDEdge* e = eit.FirstEdge(); nullptr != e; e = eit.NextEdge())
    {
      if (0 != e->m_status.MarkBits())
      {
        e->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  if (bClearFaceMarkBits)
  {
    ON_SubDFaceIterator fit(*this);
    for (const ON_SubDFace* f = fit.FirstFace(); nullptr != f; f = fit.NextFace())
    {
      if (0 != f->m_status.MarkBits())
      {
        f->m_status.SetMarkBits(0);
        clear_count++;
      }
    }
  }

  return clear_count;
}